

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSortSpecs * ImGui::TableGetSortSpecs(void)

{
  ImGuiTable *pIVar1;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTable *in_stack_00000030;
  ImGuiTable *in_stack_00000130;
  ImGuiTableSortSpecs *local_8;
  
  pIVar1 = GImGui->CurrentTable;
  if ((pIVar1->Flags & 8U) == 0) {
    local_8 = (ImGuiTableSortSpecs *)0x0;
  }
  else {
    if ((pIVar1->IsLayoutLocked & 1U) == 0) {
      TableUpdateLayout(in_stack_00000130);
    }
    TableSortSpecsBuild(in_stack_00000030);
    local_8 = &pIVar1->SortSpecs;
  }
  return local_8;
}

Assistant:

ImGuiTableSortSpecs* ImGui::TableGetSortSpecs()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);

    if (!(table->Flags & ImGuiTableFlags_Sortable))
        return NULL;

    // Require layout (in case TableHeadersRow() hasn't been called) as it may alter IsSortSpecsDirty in some paths.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    TableSortSpecsBuild(table);
    return &table->SortSpecs;
}